

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O1

void Fra_SmlAssignDist1(Fra_Sml_t *p,uint *pPat)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  Aig_Man_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  
  if (p->nFrames < 1) {
    __assert_fail("p->nFrames > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                  ,0x1b5,"void Fra_SmlAssignDist1(Fra_Sml_t *, unsigned int *)");
  }
  pAVar4 = p->pAig;
  if (p->nFrames == 1) {
    pVVar5 = pAVar4->vCis;
    if (0 < pVVar5->nSize) {
      uVar9 = 0;
      do {
        Fra_SmlAssignConst(p,(Aig_Obj_t *)pVVar5->pArray[uVar9],
                           (uint)((pPat[uVar9 >> 5 & 0x7ffffff] >> ((uint)uVar9 & 0x1f) & 1) != 0),0
                          );
        uVar9 = uVar9 + 1;
        pAVar4 = p->pAig;
        pVVar5 = pAVar4->vCis;
      } while ((long)uVar9 < (long)pVVar5->nSize);
    }
    uVar6 = p->nWordsTotal * 0x20 - 1;
    if (pAVar4->nObjs[2] < (int)uVar6) {
      uVar6 = pAVar4->nObjs[2];
    }
    if (0 < (int)uVar6) {
      uVar9 = 1;
      do {
        if ((long)pVVar5->nSize <= (long)(uVar9 - 1)) {
LAB_00606098:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        puVar1 = (uint *)((long)&p[1].pAig +
                         (uVar9 >> 5 & 0x7ffffff) * 4 +
                         (long)p->nWordsTotal *
                         (long)*(int *)((long)pVVar5->pArray[uVar9 - 1] + 0x24) * 4);
        *puVar1 = *puVar1 ^ 1 << ((byte)uVar9 & 0x1f);
        bVar11 = uVar9 != uVar6;
        uVar9 = uVar9 + 1;
      } while (bVar11);
    }
  }
  else {
    iVar2 = pAVar4->nObjs[2] - pAVar4->nRegs;
    if (0 < p->nFrames) {
      iVar8 = 0;
      lVar10 = 0;
      do {
        pAVar4 = p->pAig;
        if (pAVar4->nRegs < pAVar4->nObjs[2]) {
          lVar7 = 0;
          do {
            if (pAVar4->vCis->nSize <= lVar7) goto LAB_00606098;
            uVar6 = iVar8 + (int)lVar7;
            Fra_SmlAssignConst(p,(Aig_Obj_t *)pAVar4->vCis->pArray[lVar7],
                               (uint)((pPat[(int)uVar6 >> 5] >> (uVar6 & 0x1f) & 1) != 0),
                               (int)lVar10);
            lVar7 = lVar7 + 1;
            pAVar4 = p->pAig;
          } while (lVar7 < (long)pAVar4->nObjs[2] - (long)pAVar4->nRegs);
        }
        lVar10 = lVar10 + 1;
        iVar8 = iVar8 + iVar2;
      } while (lVar10 < p->nFrames);
    }
    pAVar4 = p->pAig;
    uVar6 = pAVar4->nObjs[2] - pAVar4->nRegs;
    pVVar5 = pAVar4->vCis;
    if ((int)uVar6 < pVVar5->nSize) {
      lVar10 = 0;
      do {
        if ((int)uVar6 < 0) goto LAB_00606098;
        uVar3 = p->nFrames * iVar2 + (int)lVar10;
        Fra_SmlAssignConst(p,(Aig_Obj_t *)pVVar5->pArray[(ulong)uVar6 + lVar10],
                           (uint)((pPat[(int)uVar3 >> 5] >> (uVar3 & 0x1f) & 1) != 0),0);
        pVVar5 = p->pAig->vCis;
        lVar10 = lVar10 + 1;
      } while ((int)(uVar6 + (int)lVar10) < pVVar5->nSize);
    }
  }
  return;
}

Assistant:

void Fra_SmlAssignDist1( Fra_Sml_t * p, unsigned * pPat )
{
    Aig_Obj_t * pObj;
    int f, i, k, Limit, nTruePis;
    assert( p->nFrames > 0 );
    if ( p->nFrames == 1 )
    {
        // copy the PI info 
        Aig_ManForEachCi( p->pAig, pObj, i )
            Fra_SmlAssignConst( p, pObj, Abc_InfoHasBit(pPat, i), 0 );
        // flip one bit
        Limit = Abc_MinInt( Aig_ManCiNum(p->pAig), p->nWordsTotal * 32 - 1 );
        for ( i = 0; i < Limit; i++ )
            Abc_InfoXorBit( Fra_ObjSim( p, Aig_ManCi(p->pAig,i)->Id ), i+1 );
    }
    else
    {
        int fUseDist1 = 0;

        // copy the PI info for each frame
        nTruePis = Aig_ManCiNum(p->pAig) - Aig_ManRegNum(p->pAig);
        for ( f = 0; f < p->nFrames; f++ )
            Aig_ManForEachPiSeq( p->pAig, pObj, i )
                Fra_SmlAssignConst( p, pObj, Abc_InfoHasBit(pPat, nTruePis * f + i), f );
        // copy the latch info 
        k = 0;
        Aig_ManForEachLoSeq( p->pAig, pObj, i )
            Fra_SmlAssignConst( p, pObj, Abc_InfoHasBit(pPat, nTruePis * p->nFrames + k++), 0 );
//        assert( p->pManFraig == NULL || nTruePis * p->nFrames + k == Aig_ManCiNum(p->pManFraig) );

        // flip one bit of the last frame
        if ( fUseDist1 ) //&& p->nFrames == 2 )
        {
            Limit = Abc_MinInt( nTruePis, p->nWordsFrame * 32 - 1 );
            for ( i = 0; i < Limit; i++ )
                Abc_InfoXorBit( Fra_ObjSim( p, Aig_ManCi(p->pAig, i)->Id ) + p->nWordsFrame*(p->nFrames-1), i+1 );
        }
    }
}